

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O2

void __thiscall FIX::double_conversion::Bignum::Zero(Bignum *this)

{
  uint *puVar1;
  int i;
  int index;
  
  for (index = 0; index < this->used_digits_; index = index + 1) {
    puVar1 = Vector<unsigned_int>::operator[](&this->bigits_,index);
    *puVar1 = 0;
  }
  this->used_digits_ = 0;
  this->exponent_ = 0;
  return;
}

Assistant:

void Bignum::Zero() {
  for (int i = 0; i < used_digits_; ++i) {
    bigits_[i] = 0;
  }
  used_digits_ = 0;
  exponent_ = 0;
}